

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall Json::StyledWriter::writeValue(StyledWriter *this,Value *value)

{
  pointer *__return_storage_ptr__;
  bool bVar1;
  ValueType VVar2;
  Json *pJVar3;
  char *value_00;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__lhs;
  uint *length;
  bool value_01;
  LargestInt value_02;
  LargestUInt value_03;
  undefined1 in_R8B;
  double value_04;
  allocator local_1f9;
  String local_1f8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d8;
  String local_1d0;
  Value *local_1b0;
  Value *childValue;
  String *name;
  iterator it;
  String local_190;
  allocator local_169;
  String local_168;
  undefined1 local_148 [8];
  Members members;
  allocator local_109;
  String local_108;
  String local_e8;
  undefined1 local_c1;
  char *pcStack_c0;
  bool ok;
  char *end;
  char *str;
  String local_90;
  String local_70;
  allocator local_39;
  String local_38;
  Value *local_18;
  Value *value_local;
  StyledWriter *this_local;
  
  local_18 = value;
  value_local = (Value *)this;
  VVar2 = Value::type(value);
  length = &switchD_0017708e::switchdataD_001819fc;
  switch(VVar2) {
  case nullValue:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"null",&local_39);
    pushValue(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    break;
  case intValue:
    pJVar3 = (Json *)Value::asLargestInt(local_18);
    valueToString_abi_cxx11_(&local_70,pJVar3,value_02);
    pushValue(this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    break;
  case uintValue:
    pJVar3 = (Json *)Value::asLargestUInt(local_18);
    valueToString_abi_cxx11_(&local_90,pJVar3,value_03);
    pushValue(this,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    break;
  case realValue:
    value_04 = Value::asDouble(local_18);
    valueToString_abi_cxx11_((String *)&str,(Json *)0x11,value_04,0,(PrecisionType)length);
    pushValue(this,(String *)&str);
    std::__cxx11::string::~string((string *)&str);
    break;
  case stringValue:
    local_c1 = Value::getString(local_18,&end,&stack0xffffffffffffff40);
    if ((bool)local_c1) {
      valueToQuotedStringN_abi_cxx11_(&local_e8,(Json *)end,pcStack_c0 + -(long)end,0,(bool)in_R8B);
      pushValue(this,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_108,"",&local_109);
      pushValue(this,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
    }
    break;
  case booleanValue:
    bVar1 = Value::asBool(local_18);
    __return_storage_ptr__ =
         &members.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    valueToString_abi_cxx11_((String *)__return_storage_ptr__,(Json *)(ulong)bVar1,value_01);
    pushValue(this,(String *)__return_storage_ptr__);
    std::__cxx11::string::~string
              ((string *)
               &members.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    break;
  case arrayValue:
    writeArrayValue(this,local_18);
    break;
  case objectValue:
    Value::getMemberNames_abi_cxx11_((Members *)local_148,local_18);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_148);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_168,"{}",&local_169);
      pushValue(this,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator((allocator<char> *)&local_169);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_190,"{",(allocator *)((long)&it._M_current + 7))
      ;
      writeWithIndent(this,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
      indent(this);
      name = (String *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_148);
      while( true ) {
        childValue = (Value *)__gnu_cxx::
                              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&name);
        local_1b0 = Value::operator[](local_18,(String *)childValue);
        writeCommentBeforeValue(this,local_1b0);
        pJVar3 = (Json *)std::__cxx11::string::c_str();
        value_00 = (char *)std::__cxx11::string::size();
        valueToQuotedString_abi_cxx11_(&local_1d0,pJVar3,value_00,(size_t)length);
        writeWithIndent(this,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::operator+=((string *)&this->document_," : ");
        writeValue(this,local_1b0);
        __lhs = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&name);
        local_1d8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_148);
        bVar1 = __gnu_cxx::operator==(__lhs,&local_1d8);
        if (bVar1) break;
        std::__cxx11::string::operator+=((string *)&this->document_,',');
        writeCommentAfterValueOnSameLine(this,local_1b0);
      }
      writeCommentAfterValueOnSameLine(this,local_1b0);
      unindent(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1f8,"}",&local_1f9);
      writeWithIndent(this,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_148);
  }
  return;
}

Assistant:

void StyledWriter::writeValue(const Value& value) {
  switch (value.type()) {
  case nullValue:
    pushValue("null");
    break;
  case intValue:
    pushValue(valueToString(value.asLargestInt()));
    break;
  case uintValue:
    pushValue(valueToString(value.asLargestUInt()));
    break;
  case realValue:
    pushValue(valueToString(value.asDouble()));
    break;
  case stringValue: {
    // Is NULL possible for value.string_? No.
    char const* str;
    char const* end;
    bool ok = value.getString(&str, &end);
    if (ok)
      pushValue(valueToQuotedStringN(str, static_cast<size_t>(end - str)));
    else
      pushValue("");
    break;
  }
  case booleanValue:
    pushValue(valueToString(value.asBool()));
    break;
  case arrayValue:
    writeArrayValue(value);
    break;
  case objectValue: {
    Value::Members members(value.getMemberNames());
    if (members.empty())
      pushValue("{}");
    else {
      writeWithIndent("{");
      indent();
      auto it = members.begin();
      for (;;) {
        const String& name = *it;
        const Value& childValue = value[name];
        writeCommentBeforeValue(childValue);
        writeWithIndent(valueToQuotedString(name.c_str(), name.size()));
        document_ += " : ";
        writeValue(childValue);
        if (++it == members.end()) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        document_ += ',';
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("}");
    }
  } break;
  }
}